

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O1

CURLcode curl_global_init_mem
                   (long flags,curl_malloc_callback m,curl_free_callback f,curl_realloc_callback r,
                   curl_strdup_callback s,curl_calloc_callback c)

{
  atomic_int aVar1;
  CURLcode CVar2;
  
  aVar1 = s_lock;
  CVar2 = CURLE_FAILED_INIT;
  if (c != (curl_calloc_callback)0x0 &&
      ((s != (curl_strdup_callback)0x0 && r != (curl_realloc_callback)0x0) &&
      (f != (curl_free_callback)0x0 && m != (curl_malloc_callback)0x0))) {
    LOCK();
    s_lock = 1;
    UNLOCK();
    if (aVar1 != 0) {
      do {
      } while( true );
    }
    if (initialized == 0) {
      Curl_cmalloc = m;
      Curl_cfree = f;
      Curl_crealloc = r;
      Curl_cstrdup = s;
      Curl_ccalloc = c;
      CVar2 = global_init(0,SUB81(m,0));
    }
    else {
      initialized = initialized + 1;
      CVar2 = CURLE_OK;
    }
    s_lock = 0;
  }
  return CVar2;
}

Assistant:

CURLcode curl_global_init_mem(long flags, curl_malloc_callback m,
                              curl_free_callback f, curl_realloc_callback r,
                              curl_strdup_callback s, curl_calloc_callback c)
{
  CURLcode result;

  /* Invalid input, return immediately */
  if(!m || !f || !r || !s || !c)
    return CURLE_FAILED_INIT;

  global_init_lock();

  if(initialized) {
    /* Already initialized, do not do it again, but bump the variable anyway to
       work like curl_global_init() and require the same amount of cleanup
       calls. */
    initialized++;
    global_init_unlock();
    return CURLE_OK;
  }

  /* set memory functions before global_init() in case it wants memory
     functions */
  Curl_cmalloc = m;
  Curl_cfree = f;
  Curl_cstrdup = s;
  Curl_crealloc = r;
  Curl_ccalloc = c;

  /* Call the actual init function, but without setting */
  result = global_init(flags, FALSE);

  global_init_unlock();

  return result;
}